

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlb_helper.c
# Opt level: O3

void arm_cpu_do_transaction_failed_arm
               (CPUState *cs,hwaddr physaddr,vaddr addr,uint size,MMUAccessType access_type,
               int mmu_idx,MemTxAttrs attrs,MemTxResult response,uintptr_t retaddr)

{
  ARMCPU *cpu;
  ARMMMUFaultInfo local_44;
  
  local_44.s2addr = 0;
  local_44.level = 0;
  local_44.domain = 0;
  local_44.stage2 = false;
  local_44.s1ptw = false;
  local_44.ea = false;
  local_44._19_1_ = 0;
  cpu_restore_state_arm(cs,retaddr,true);
  local_44.ea = response != 2;
  local_44.type = ARMFault_SyncExternal;
  arm_deliver_fault((ARMCPU *)cs,addr,access_type,mmu_idx,&local_44);
}

Assistant:

void arm_cpu_do_transaction_failed(CPUState *cs, hwaddr physaddr,
                                   vaddr addr, unsigned size,
                                   MMUAccessType access_type,
                                   int mmu_idx, MemTxAttrs attrs,
                                   MemTxResult response, uintptr_t retaddr)
{
    ARMCPU *cpu = ARM_CPU(cs);
    ARMMMUFaultInfo fi = { 0 };

    /* now we have a real cpu fault */
    cpu_restore_state(cs, retaddr, true);

    fi.ea = arm_extabort_type(response);
    fi.type = ARMFault_SyncExternal;
    arm_deliver_fault(cpu, addr, access_type, mmu_idx, &fi);
}